

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O2

void mreadmsg(monst *mtmp,obj *otmp)

{
  uint uVar1;
  short sVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  char onambuf [256];
  
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001ee2b3;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ee256;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ee24d;
    }
    else {
LAB_001ee24d:
      if (ublindf == (obj *)0x0) goto LAB_001ee30c;
LAB_001ee256:
      if (ublindf->oartifact != '\x1d') goto LAB_001ee30c;
    }
    if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
       (((youmonst.data)->mflags3 & 0x100) != 0)) {
      bVar6 = false;
      if (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) || ((mtmp->data->mflags3 & 0x200) == 0))
      goto LAB_001ee30e;
      goto LAB_001ee2b3;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 != '\0') {
LAB_001ee2b3:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((char)uVar1 < '\0') goto LAB_001ee30c;
      }
      else {
        bVar6 = false;
        if (((char)uVar1 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
        goto LAB_001ee30e;
      }
      bVar6 = (uVar1 >> 9 & 1) == 0 && (u._1052_1_ & 0x20) == 0;
      goto LAB_001ee30e;
    }
  }
LAB_001ee30c:
  bVar6 = false;
LAB_001ee30e:
  if (flags.soundok != '\0' || bVar6) {
    uVar1 = *(uint *)&otmp->field_0x4a;
    *(uint *)&otmp->field_0x4a = uVar1 | 0x20;
    sVar2 = urole.malenum;
    if (bVar6) {
      pcVar5 = singular(otmp,doname);
      strcpy(onambuf,pcVar5);
      urole.malenum = sVar2;
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf | uVar1 & 0x40;
      pcVar5 = Monnam(mtmp);
      pline("%s reads %s!",pcVar5,onambuf);
    }
    else {
      *(uint *)&otmp->field_0x4a = uVar1 & 0xffffffbf | 0x20;
      if (urole.malenum == 0x161) {
        urole.malenum = 0;
      }
      pcVar5 = singular(otmp,doname);
      strcpy(onambuf,pcVar5);
      urole.malenum = sVar2;
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf | uVar1 & 0x40;
      pcVar5 = x_monnam(mtmp,2,(char *)0x0,0xb,'\0');
      You_hear("%s reading %s.",pcVar5,onambuf);
    }
    if ((mtmp->field_0x62 & 0x20) != 0) {
      if (bVar6) {
        pcVar5 = mon_nam(mtmp);
      }
      else {
        iVar4 = pronoun_gender(level,mtmp);
        pcVar5 = genders[iVar4].he;
      }
      pline("Being confused, %s mispronounces the magic words...",pcVar5);
    }
  }
  return;
}

Assistant:

static void mreadmsg(struct monst *mtmp, struct obj *otmp)
{
	boolean vismon = canseemon(level, mtmp);
	char onambuf[BUFSZ];
	short saverole;
	unsigned savebknown;

	if (!vismon && !flags.soundok)
	    return;		/* no feedback */

	otmp->dknown = 1;  /* seeing or hearing it read reveals its label */
	/* shouldn't be able to hear curse/bless status of unseen scrolls;
	   for priest characters, bknown will always be set during naming */
	savebknown = otmp->bknown;
	saverole = Role_switch;
	if (!vismon) {
	    otmp->bknown = 0;
	    if (Role_if (PM_PRIEST)) Role_switch = 0;
	}
	strcpy(onambuf, singular(otmp, doname));
	Role_switch = saverole;
	otmp->bknown = savebknown;

	if (vismon)
	    pline("%s reads %s!", Monnam(mtmp), onambuf);
	else
	    You_hear("%s reading %s.",
		x_monnam(mtmp, ARTICLE_A, NULL,
		    (SUPPRESS_IT|SUPPRESS_INVISIBLE|SUPPRESS_SADDLE), FALSE),
		onambuf);

	if (mtmp->mconf)
	    pline("Being confused, %s mispronounces the magic words...",
		  vismon ? mon_nam(mtmp) : mhe(level, mtmp));
}